

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

void Mio_LibraryTransferDelays(Mio_Library_t *pLibD,Mio_Library_t *pLibS)

{
  Mio_Gate_t *pGate;
  Mio_Gate_t *pGate_00;
  Mio_Pin_t *pPin;
  Mio_Pin_t *pPin_00;
  
  for (pGate = Mio_LibraryReadGates(pLibS); pGate != (Mio_Gate_t *)0x0;
      pGate = Mio_GateReadNext(pGate)) {
    for (pGate_00 = Mio_LibraryReadGates(pLibD); pGate_00 != (Mio_Gate_t *)0x0;
        pGate_00 = Mio_GateReadNext(pGate_00)) {
      if ((pGate_00->field_15).uTruth == (pGate->field_15).uTruth) {
        pPin = Mio_GateReadPins(pGate);
        for (pPin_00 = Mio_GateReadPins(pGate_00); pPin_00 != (Mio_Pin_t *)0x0;
            pPin_00 = Mio_PinReadNext(pPin_00)) {
          if (pPin == (Mio_Pin_t *)0x0) {
            pPin_00->dDelayBlockRise = 0.0;
            pPin_00->dDelayBlockFall = 0.0;
            pPin_00->dDelayBlockMax = 0.0;
            pPin = (Mio_Pin_t *)0x0;
          }
          else {
            pPin_00->dDelayBlockRise = pPin->dDelayBlockRise;
            pPin_00->dDelayBlockFall = pPin->dDelayBlockFall;
            pPin_00->dDelayBlockMax = pPin->dDelayBlockMax;
            pPin = Mio_PinReadNext(pPin);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Mio_LibraryTransferDelays( Mio_Library_t * pLibD, Mio_Library_t * pLibS )
{
    Mio_Gate_t * pGateD, * pGateS;
    Mio_Pin_t * pPinD, * pPinS;
    Mio_LibraryForEachGate( pLibS, pGateS )
    {
        Mio_LibraryForEachGate( pLibD, pGateD )
        {
            if ( pGateD->uTruth != pGateS->uTruth )
                continue;
            pPinS = Mio_GateReadPins( pGateS );
            Mio_GateForEachPin( pGateD, pPinD )
            {
                if (pPinS)
                {
                    pPinD->dDelayBlockRise = pPinS->dDelayBlockRise;
                    pPinD->dDelayBlockFall = pPinS->dDelayBlockFall;
                    pPinD->dDelayBlockMax  = pPinS->dDelayBlockMax;
                    pPinS = Mio_PinReadNext(pPinS);
                }
                else
                {
                    pPinD->dDelayBlockRise = 0;
                    pPinD->dDelayBlockFall = 0;
                    pPinD->dDelayBlockMax  = 0;
                }
            }
        }
    }
}